

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCex.c
# Opt level: O2

int Gia_ManSetFailedPoCex(Gia_Man_t *pAig,Abc_Cex_t *p)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  uint uVar6;
  int v;
  int iVar7;
  
  if (pAig->vCis->nSize - pAig->nRegs != p->nPis) {
    __assert_fail("Gia_ManPiNum(pAig) == p->nPis",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCex.c"
                  ,0x8b,"int Gia_ManSetFailedPoCex(Gia_Man_t *, Abc_Cex_t *)");
  }
  Gia_ManCleanMark0(pAig);
  p->iPo = -1;
  iVar3 = 0;
  iVar7 = p->nRegs;
  do {
    if (p->iFrame < iVar3) {
      Gia_ManCleanMark0(pAig);
      return p->iPo;
    }
    for (v = 0; iVar1 = v + iVar7, v < pAig->vCis->nSize - pAig->nRegs; v = v + 1) {
      pGVar4 = Gia_ManCi(pAig,v);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      *(ulong *)pGVar4 =
           *(ulong *)pGVar4 & 0xffffffffbfffffff |
           (ulong)(((uint)(&p[1].iPo)[iVar1 >> 5] >> ((byte)iVar1 & 0x1f) & 1) << 0x1e);
    }
    for (iVar7 = 0; iVar7 < pAig->nObjs; iVar7 = iVar7 + 1) {
      pGVar4 = Gia_ManObj(pAig,iVar7);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar2 = *(ulong *)pGVar4;
      if ((uVar2 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar2) {
        uVar6 = (uint)(uVar2 >> 0x20);
        *(ulong *)pGVar4 =
             uVar2 & 0xffffffff3fffffff |
             (ulong)(((uVar6 >> 0x1d ^ *(uint *)(pGVar4 + -(ulong)(uVar6 & 0x1fffffff)) >> 0x1e) &
                      ((uint)(uVar2 >> 0x1d) & 7 ^ *(uint *)(pGVar4 + -(uVar2 & 0x1fffffff)) >> 0x1e
                      ) & 1) << 0x1e);
      }
    }
    for (iVar7 = 0; iVar7 < pAig->vCos->nSize; iVar7 = iVar7 + 1) {
      pGVar4 = Gia_ManCo(pAig,iVar7);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar6 = (uint)*(ulong *)pGVar4;
      *(ulong *)pGVar4 =
           *(ulong *)pGVar4 & 0xffffffffbfffffff |
           (ulong)((uVar6 * 2 ^ *(uint *)(pGVar4 + -(ulong)(uVar6 & 0x1fffffff))) & 0x40000000);
    }
    for (iVar7 = 0; iVar7 < pAig->nRegs; iVar7 = iVar7 + 1) {
      pGVar4 = Gia_ManCo(pAig,(pAig->vCos->nSize - pAig->nRegs) + iVar7);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      pGVar5 = Gia_ManCi(pAig,(pAig->vCis->nSize - pAig->nRegs) + iVar7);
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      *(ulong *)pGVar5 =
           *(ulong *)pGVar5 & 0xffffffffbfffffff | (ulong)((uint)*(undefined8 *)pGVar4 & 0x40000000)
      ;
    }
    for (iVar7 = 0; iVar7 < pAig->vCos->nSize - pAig->nRegs; iVar7 = iVar7 + 1) {
      pGVar4 = Gia_ManCo(pAig,iVar7);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      if ((pGVar4->field_0x3 & 0x40) != 0) {
        p->iPo = iVar7;
        p->iFrame = iVar3;
        p->nBits = iVar1;
        break;
      }
    }
    iVar3 = iVar3 + 1;
    iVar7 = iVar1;
  } while( true );
}

Assistant:

int Gia_ManSetFailedPoCex( Gia_Man_t * pAig, Abc_Cex_t * p )
{
    Gia_Obj_t * pObj, * pObjRi, * pObjRo;
    int i, k, iBit = 0;
    assert( Gia_ManPiNum(pAig) == p->nPis );
    Gia_ManCleanMark0(pAig);
    p->iPo = -1;
//    Gia_ManForEachRo( pAig, pObj, i )
//       pObj->fMark0 = Abc_InfoHasBit(p->pData, iBit++);
    iBit = p->nRegs;
    for ( i = 0; i <= p->iFrame; i++ )
    {
        Gia_ManForEachPi( pAig, pObj, k )
            pObj->fMark0 = Abc_InfoHasBit(p->pData, iBit++);
        Gia_ManForEachAnd( pAig, pObj, k )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                           (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachCo( pAig, pObj, k )
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
        Gia_ManForEachRiRo( pAig, pObjRi, pObjRo, k )
            pObjRo->fMark0 = pObjRi->fMark0;
        // check the POs
        Gia_ManForEachPo( pAig, pObj, k )
	    {
            if ( !pObj->fMark0 )
                continue;
            p->iPo = k;
            p->iFrame = i;
            p->nBits = iBit;
            break;
	    }
    }
    Gia_ManCleanMark0(pAig);
    return p->iPo;
}